

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O2

void CDTUtil::writeBASICLoader(path *fname,byte screenMode,byte *palette)

{
  byte bVar1;
  long lVar2;
  byte p [32];
  word in_stack_fffffffffffffef0;
  allocator<char> local_109;
  undefined2 local_108;
  undefined2 local_106;
  undefined1 local_104;
  undefined1 local_103;
  undefined2 local_102;
  undefined2 local_100;
  undefined2 local_fe;
  undefined2 local_fc;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined2 local_f8;
  undefined2 local_f6;
  undefined2 local_f4;
  undefined2 local_f2;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  string local_e8;
  byte local_c8 [7];
  undefined4 local_c1;
  undefined2 local_bd;
  byte local_bb;
  undefined4 local_ba;
  undefined2 local_b6;
  undefined1 local_b4;
  undefined2 local_b3;
  undefined1 local_b1;
  undefined2 local_b0;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined2 local_aa;
  undefined1 local_a8;
  undefined2 local_a7;
  undefined1 local_a5;
  undefined2 local_a4;
  undefined1 local_a2;
  undefined2 local_a1;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined2 local_9b;
  undefined1 local_99;
  undefined2 local_98;
  undefined1 local_96;
  undefined2 local_95;
  undefined1 local_93;
  undefined2 local_92;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined4 local_2c;
  
  local_bb = *palette;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    bVar1 = palette[lVar2 + 1];
    *(byte *)(&local_108 + lVar2) = bVar1 / 10 + 0x30;
    *(byte *)((long)&local_108 + lVar2 * 2 + 1) = bVar1 % 10 | 0x30;
  }
  local_c8[0] = '\x0f';
  local_c8[1] = '\0';
  local_c8[2] = '\n';
  local_c8[3] = '\0';
  local_c8[4] = 0xad;
  local_c8[5] = ' ';
  local_c8[6] = (&DAT_0015834e)[screenMode];
  local_c1 = 0x82018a01;
  local_bd = 0x1920;
  local_ba = 0x14003600;
  local_b6 = 0x8c00;
  local_b4 = 0x20;
  local_b3 = local_108;
  local_b1 = 0x2c;
  local_b0 = local_106;
  local_ae = 0x2c;
  local_ad = local_104;
  local_ac = local_103;
  local_ab = 0x2c;
  local_aa = local_102;
  local_a8 = 0x2c;
  local_a7 = local_100;
  local_a5 = 0x2c;
  local_a4 = local_fe;
  local_a2 = 0x2c;
  local_a1 = local_fc;
  local_9f = 0x2c;
  local_9e = local_fa;
  local_9d = local_f9;
  local_9c = 0x2c;
  local_9b = local_f8;
  local_99 = 0x2c;
  local_98 = local_f6;
  local_96 = 0x2c;
  local_95 = local_f4;
  local_93 = 0x2c;
  local_92 = local_f2;
  local_90 = 0x2c;
  local_8f = local_f0;
  local_8e = local_ef;
  local_8d = 0x2c;
  local_8c = local_ee;
  local_8b = local_ed;
  local_8a = 0x2c;
  local_89 = local_ec;
  local_88 = local_eb;
  local_87 = 0x2c;
  local_86 = local_ea;
  local_85 = local_e9;
  local_84 = 0xd209e001e001200;
  uStack_7c = 0x20ec200eefe90000;
  local_74 = 0xc30028001e000f19;
  uStack_6c = 0x20a201f600000d20;
  local_64 = 0xd202ce900000d;
  uStack_5c = 0xf600000d202cf600;
  local_54 = 0xd20b00032000b00;
  uStack_4c = 0x3c001400e90000;
  local_44 = 0x20a8017fff1c20aa;
  uStack_3c = 0x2265646f632122;
  local_34 = 0x1c20830046000a;
  local_2c = 0x80;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"LOADER",&local_109);
  writeTapeFile(fname,&local_e8,'\0',local_c8,0xa0,0x170,0,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

static void writeBASICLoader(const std::filesystem::path & fname, byte screenMode, const byte* palette) {
		constexpr byte mode_values[] = { 0x0E, 0x0F, 0x10 };
		byte border = 0;
		border = *palette;
		// Border is always the first entry in the palette
		++palette;

		// BASIC number encoding format for the palette entries
		byte p[32];
		for (aint i = 0, n = 0; i < 16; ++i, n+=2) {
			p[n] = (palette[i] / 10) + '0';
			p[n+1] = (palette[i] % 10) + '0';
		}

		const word callad = SaveCDT_AmstradCPC464_ORG;
		const word himem = callad - 1; // himem is one byte lower than the program we load

		// BASIC loader to set the screen mode, border color, palette, and then load the asm loader and execute it
		const byte basic[] = {
			// Line format <Line Len (int16)> <line no (int16)> <tokens...> <0x00>
			//
			//		10		MODE		N						:		CLS  :     BORDER		N
			15, 00, 10, 00, 0xAD, 0x20, mode_values[screenMode], 0x01, 0x8A, 0x01, 0x82, 0x20, 0x19, border, 0x00,
			//		20		DATA [16 bytes of int8]
			54, 00, 20, 00, 0x8C, 0x20, 
				p[0], p[1], ',', p[2], p[3], ',', p[4], p[5], ',', p[6], p[7], ',',
				p[8], p[9], ',', p[10], p[11], ',', p[12], p[13], ',', p[14], p[15], ',',
				p[16], p[17], ',', p[18], p[19], ',', p[20], p[21], ',', p[22], p[23], ',',
				p[24], p[25], ',', p[26], p[27], ',', p[28], p[29], ',', p[30], p[31], 0x00,
			//		30		FOR			i						=	  0			  TO		  15
			18, 00,	30, 00, 0x9E, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0xEF, 0x0E, 0x20, 0xEC, 0x20, 0x19, 0x0F, 0x00,
			//		40		READ		v						:	  INK		  	i					  ,           v                       ,                             v
			30, 00, 40, 00, 0xC3, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x01, 0xA2, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x00,
			//		50		NEXT		i
			11, 00,	50, 00, 0xB0, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x00,
			//		60		MEMORY		&NNNN			  :		LOAD 
			20, 00, 60, 00, 0xAA, 0x20, 0x1C, himem & 0xFF, himem >> 8, 0x01,	0xA8, 0x20, 0x22, '!', 'c', 'o', 'd', 'e', 0x22, 0x00,
			//		70		CALL
			10, 00, 70, 00, 0x83, 0x20, 0x1C, callad & 0xFF, callad >> 8, 0x00,
			// EOF
			00, 00 
		};
		constexpr aint basiclen = sizeof(basic);
		writeTapeFile(fname, "LOADER", FileTypeBASIC, basic, basiclen, 0x0170, 0x0000, DefaultPause);
	}